

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntaxAnalysis.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* condition(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *__return_storage_ptr__,function *fn,string *label,
           vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           *intermediateInner)

{
  uint uVar1;
  uint uVar2;
  tokenCategory tVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  uint uVar7;
  ulong *puVar8;
  size_type *psVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  string __str;
  string vt2;
  string __str_1;
  string vt1;
  value_type local_d0;
  value_type local_b0;
  function *local_90;
  long local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  long *local_78 [2];
  long local_68 [2];
  string local_58;
  string *local_38;
  
  lVar11 = (long)intermediateCodeInner_abi_cxx11_.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)intermediateCodeInner_abi_cxx11_.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_38 = label;
  iVar5 = expression(fn,&local_58);
  local_88 = lVar11;
  local_80 = __return_storage_ptr__;
  if (iVar5 == 2) {
    uVar10 = ((long)formerAns_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)formerAns_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    local_90 = fn;
    if (!CARRY8(~(long)tokenPointer,uVar10)) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    uVar1 = formerAns_abi_cxx11_.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[~(long)tokenPointer + uVar10].second;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar13 = 1;
    if (9 < uVar2) {
      uVar10 = (ulong)uVar2;
      uVar4 = 4;
      do {
        uVar13 = uVar4;
        uVar7 = (uint)uVar10;
        if (uVar7 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_001113a3;
        }
        if (uVar7 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_001113a3;
        }
        if (uVar7 < 10000) goto LAB_001113a3;
        uVar10 = uVar10 / 10000;
        uVar4 = uVar13 + 4;
      } while (99999 < uVar7);
      uVar13 = uVar13 + 1;
    }
LAB_001113a3:
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar13 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_d0._M_dataplus._M_p + (uVar1 >> 0x1f),uVar13,uVar2);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
    __return_storage_ptr__ = local_80;
    lVar11 = local_88;
    fn = local_90;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_b0.field_2._M_allocated_capacity = *puVar8;
      local_b0.field_2._8_8_ = plVar6[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar8;
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_b0._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&outputErr_abi_cxx11_,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  getToken();
  tVar3 = Token;
  getToken();
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_allocated_capacity =
       local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  iVar5 = expression(fn,&local_b0);
  local_90 = (function *)CONCAT44(local_90._4_4_,tVar3);
  if (iVar5 == 2) {
    uVar10 = ((long)formerAns_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)formerAns_abi_cxx11_.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    if (!CARRY8(~(long)tokenPointer,uVar10)) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    uVar1 = formerAns_abi_cxx11_.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start[~(long)tokenPointer + uVar10].second;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    uVar13 = 1;
    if (9 < uVar2) {
      uVar10 = (ulong)uVar2;
      uVar4 = 4;
      do {
        uVar13 = uVar4;
        uVar7 = (uint)uVar10;
        if (uVar7 < 100) {
          uVar13 = uVar13 - 2;
          goto LAB_00111565;
        }
        if (uVar7 < 1000) {
          uVar13 = uVar13 - 1;
          goto LAB_00111565;
        }
        if (uVar7 < 10000) goto LAB_00111565;
        uVar10 = uVar10 / 10000;
        uVar4 = uVar13 + 4;
      } while (99999 < uVar7);
      uVar13 = uVar13 + 1;
    }
LAB_00111565:
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct((ulong)local_78,(char)uVar13 - (char)((int)uVar1 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_78[0]),uVar13,uVar2);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_78);
    __return_storage_ptr__ = local_80;
    lVar11 = local_88;
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0.field_2._8_8_ = plVar6[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar9;
      local_d0._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_d0._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&outputErr_abi_cxx11_,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
  }
  uVar12 = (ulong)((int)(lVar11 >> 3) * -0x55555555);
  uVar10 = ((long)intermediateCodeInner_abi_cxx11_.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)intermediateCodeInner_abi_cxx11_.
                  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar12 <= uVar10 && uVar10 - uVar12 != 0) {
    lVar11 = uVar12 * 0x18;
    do {
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::push_back(intermediateInner,
                  (value_type *)
                  ((long)&((intermediateCodeInner_abi_cxx11_.
                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar11));
      uVar12 = uVar12 + 1;
      uVar10 = ((long)intermediateCodeInner_abi_cxx11_.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)intermediateCodeInner_abi_cxx11_.
                      super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar11 = lVar11 + 0x18;
    } while (uVar12 <= uVar10 && uVar10 - uVar12 != 0);
  }
  addCondition(__return_storage_ptr__,&local_58,&local_b0,local_38,(tokenCategory)local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string>
condition(function &fn, string &label, vector<vector<string>> &intermediateInner) {//条件
    int pos1 = intermediateCodeInner.size();
    string vt1;
    if (expressTypeEqual(expression(fn, vt1), CHARTK)) {
        error_syntax(to_string(formerAns.at(formerAns.size() - 1 - tokenPointer).second) + " f");
    }
    getToken();//isRelation();
    enum tokenCategory relation = Token;
    getToken();
    string vt2;
    if (expressTypeEqual(expression(fn, vt2), CHARTK)) {
        error_syntax(to_string(formerAns.at(formerAns.size() - 1 - tokenPointer).second) + " f");
    }
    for (int i = pos1; i < intermediateCodeInner.size(); i++) {
        intermediateInner.push_back(intermediateCodeInner.at(i));
    }
    //outputAns.emplace_back(syntaxCategoryString[23]);
    return addCondition(vt1, vt2, label, relation);
}